

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O3

void __thiscall Blowfish_CFB_Test::TestBody(Blowfish_CFB_Test *this)

{
  int iVar1;
  EVP_CIPHER *pEVar2;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  BlowfishTestCase *key;
  ScopedTrace gtest_trace_136;
  int out_bytes;
  int final_bytes;
  uint test_num;
  uint8_t out [16];
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  ScopedEVP_CIPHER_CTX ctx;
  ScopedTrace local_1d1;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  Bytes local_1c0;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  AssertHelper local_190;
  int local_184;
  int local_180;
  uint local_17c;
  long local_178 [2];
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [8];
  long local_d0;
  
  local_17c = 0;
  key = kTests;
  lVar3 = 0xc0;
  do {
    local_17c = local_17c + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_1d1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x88,&local_17c);
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
    pEVar2 = (EVP_CIPHER *)EVP_bf_cfb();
    iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,pEVar2,(ENGINE *)0x0,
                               key->key,key->iv);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)
                 "EVP_EncryptInit_ex(ctx.get(), EVP_bf_cfb(), nullptr, test.key, test.iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x8f,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
LAB_001209d9:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_168._1_7_,local_168[0]) != local_158) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_168._1_7_,local_168[0]),
                        local_158[0]._M_allocated_capacity + 1);
      }
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
      if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a8,local_1a8);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
LAB_00120bb8:
      testing::ScopedTrace::~ScopedTrace(&local_1d1);
      return;
    }
    local_d0 = lVar3;
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,(uchar *)local_178,
                              &local_184,key->plaintext,0x10);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)
                 "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x91,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      goto LAB_001209d9;
    }
    iVar1 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,
                                (uchar *)((long)local_178 + (long)local_184),&local_180);
    local_1b0[0] = (internal)(iVar1 != 0);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_168,(internal *)local_1b0,
                 (AssertionResult *)"EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x92,(char *)CONCAT71(local_168._1_7_,local_168[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      goto LAB_001209d9;
    }
    local_1b0 = (undefined1  [8])((long)local_180 + (long)local_184);
    local_1d0 = (undefined1  [8])0x10;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_168,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)local_1b0,(unsigned_long *)local_1d0);
    if (local_168[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b0);
      pcVar4 = "";
      if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x94,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
      if (local_1b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1b0 + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1d0 = (undefined1  [8])local_178;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
    local_1b0 = (undefined1  [8])key->cfb_ciphertext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_168,"Bytes(test.cfb_ciphertext)","Bytes(out)",(Bytes *)local_1b0,
               (Bytes *)local_1d0);
    if (local_168[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b0);
      pcVar4 = "";
      if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x95,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
      if (local_1b0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1b0 + 8))();
      }
    }
    if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,local_160);
    }
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_168);
    pEVar2 = (EVP_CIPHER *)EVP_bf_cfb();
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_168,pEVar2,(ENGINE *)0x0,key->key,key->iv);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cfb(), nullptr, test.key, test.iv)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x99,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
LAB_00120b58:
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      if (local_1b0 != (undefined1  [8])&local_1a0) {
        operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
      }
      if ((long *)local_1c0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_1c0.span_.data_ + 8))();
      }
      if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c8,local_1c8);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_168);
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
      goto LAB_00120bb8;
    }
    iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_168,(uchar *)local_178,&local_184,
                              key->cfb_ciphertext,0x10);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.cfb_ciphertext, sizeof(test.cfb_ciphertext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x9c,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
      goto LAB_00120b58;
    }
    iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)local_168,
                                (uchar *)((long)local_178 + (long)local_184),&local_180);
    local_1d0[0] = iVar1 != 0;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x9e,(char *)local_1b0);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0);
      goto LAB_00120b58;
    }
    local_1d0 = (undefined1  [8])((long)local_180 + (long)local_184);
    local_1c0.span_.data_ = &DAT_00000010;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_1b0,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)local_1d0,(unsigned_long *)&local_1c0);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d0);
      pcVar4 = "";
      if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_1a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0xa0,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,local_1a8);
    }
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1c0.span_.data_ = (uchar *)local_178;
    local_1c0.span_.size_ = 0x10;
    local_1d0 = (undefined1  [8])key->plaintext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1b0,"Bytes(test.plaintext)","Bytes(out)",(Bytes *)local_1d0,
               &local_1c0);
    lVar3 = local_d0;
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d0);
      pcVar4 = "";
      if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_1a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0xa1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,local_1a8);
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_168);
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
    testing::ScopedTrace::~ScopedTrace(&local_1d1);
    key = key + 1;
    lVar3 = lVar3 + -0x60;
    if (lVar3 == 0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Blowfish, CFB) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.cfb_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_cfb(), nullptr, test.key,
                                   test.iv));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    ASSERT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.cfb_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cfb(), nullptr,
                                   test.key, test.iv));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.cfb_ciphertext,
                                  sizeof(test.cfb_ciphertext)));
    ASSERT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out));
  }
}